

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialogPrivate::adoptChildWidget(QProgressDialogPrivate *this,QWidget *c)

{
  QWidget *parent;
  
  if (c != (QWidget *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    if (*(QWidget **)(*(long *)&c->field_0x8 + 0x10) == parent) {
      QWidget::hide(c);
    }
    else {
      QWidget::setParent(c,parent,(WindowFlags)0x0);
    }
    ensureSizeIsAtLeastSizeHint(this);
    layout(this);
    QWidget::show(c);
    return;
  }
  ensureSizeIsAtLeastSizeHint(this);
  layout(this);
  return;
}

Assistant:

void QProgressDialogPrivate::adoptChildWidget(QWidget *c)
{
    Q_Q(QProgressDialog);

    if (c) {
        if (c->parentWidget() == q)
            c->hide(); // until after ensureSizeIsAtLeastSizeHint()
        else
            c->setParent(q, { });
    }
    ensureSizeIsAtLeastSizeHint();
    //The layout should be updated again to prevent layout errors when the new 'widget' is replaced
    layout();
    if (c)
        c->show();
}